

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_Value.h
# Opt level: O3

bool __thiscall
choc::value::Type::AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup>::operator==
          (AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup> *this,
          AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup> *other)

{
  byte bVar1;
  RepeatedGroup *pRVar2;
  RepeatedGroup *pRVar3;
  bool bVar4;
  ulong uVar5;
  long lVar6;
  
  if (this->size != other->size) {
    return false;
  }
  if (this->size == 0) {
    return true;
  }
  lVar6 = 0x18;
  uVar5 = 0;
  do {
    pRVar2 = this->items;
    pRVar3 = other->items;
    if (*(int *)((long)pRVar2 + lVar6 + -0x18) != *(int *)((long)pRVar3 + lVar6 + -0x18)) {
      return false;
    }
    bVar1 = *(byte *)((long)pRVar2 + lVar6 + -0x10);
    if (bVar1 != *(byte *)((long)pRVar3 + lVar6 + -0x10)) {
      return false;
    }
    if (bVar1 < 0x80) {
      if (bVar1 == 0x30) {
        if (*(char *)((long)pRVar2 + lVar6 + -8) != *(char *)((long)pRVar3 + lVar6 + -8)) {
          return false;
        }
        if (*(int *)((long)pRVar2 + lVar6 + -4) != *(int *)((long)pRVar3 + lVar6 + -4)) {
          return false;
        }
      }
      else if (bVar1 == 0x40) {
        if (*(char *)((long)pRVar2 + lVar6 + -8) != *(char *)((long)pRVar3 + lVar6 + -8)) {
          return false;
        }
        if (*(int *)((long)pRVar2 + lVar6 + -4) != *(int *)((long)pRVar3 + lVar6 + -4)) {
          return false;
        }
        if (*(int *)((long)&pRVar2->repetitions + lVar6) !=
            *(int *)((long)&pRVar3->repetitions + lVar6)) {
          return false;
        }
      }
    }
    else {
      if (bVar1 == 0x80) {
        bVar4 = operator==(*(AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup> **)
                            ((long)pRVar2 + lVar6 + -8),
                           *(AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup> **)
                            ((long)pRVar3 + lVar6 + -8));
      }
      else {
        if (bVar1 != 0x90) goto LAB_001cb3e5;
        bVar4 = Object::operator==(*(Object **)((long)pRVar2 + lVar6 + -8),
                                   *(Object **)((long)pRVar3 + lVar6 + -8));
      }
      if (bVar4 == false) {
        return false;
      }
    }
LAB_001cb3e5:
    uVar5 = uVar5 + 1;
    lVar6 = lVar6 + 0x28;
    if (this->size <= uVar5) {
      return true;
    }
  } while( true );
}

Assistant:

bool operator== (const AllocatedVector& other) const
    {
        if (size != other.size)
            return false;

        for (decltype (size) i = 0; i < size; ++i)
            if (! (items[i] == other.items[i]))
                return false;

        return true;
    }